

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::PerfEvents::PerfEvents(PerfEvents *this,PerfEvents *param_1)

{
  PerfEvents *param_1_local;
  PerfEvents *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__PerfEvents_009c0e38;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

PerfEvents::PerfEvents(PerfEvents&&) noexcept = default;